

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adl_lsp_server.h
# Opt level: O3

DidCloseTextDocumentParams *
lscpp::experimental::get_params<(lscpp::experimental::method_kind)6>
          (DidCloseTextDocumentParams *__return_storage_ptr__,any *params)

{
  long *plVar1;
  
  plVar1 = (long *)std::__any_caster<lscpp::protocol::DidCloseTextDocumentParams>(params);
  if (plVar1 != (long *)0x0) {
    (__return_storage_ptr__->textDocument).uri._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->textDocument).uri.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,*plVar1,plVar1[1] + *plVar1);
    return __return_storage_ptr__;
  }
  std::__throw_bad_any_cast();
}

Assistant:

auto get_params(std::any params) {
  return std::any_cast<to_params_t<Kind>>(params);
}